

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcProjectionCurve::~IfcProjectionCurve(IfcProjectionCurve *this)

{
  ~IfcProjectionCurve(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

IfcProjectionCurve() : Object("IfcProjectionCurve") {}